

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2_pack16.h
# Opt level: O0

void ncnn::pooling2x2s2_max_pack16_avx512(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  __m512 _max;
  __m512 _max1;
  __m512 _max0;
  __m512 _r11;
  __m512 _r10;
  __m512 _r01;
  __m512 _r00;
  int j;
  int i;
  float *r1;
  float *r0;
  float *outptr;
  Mat img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  int local_510;
  int local_50c;
  undefined1 (*local_508) [64];
  undefined1 (*local_500) [64];
  undefined8 *local_4a0;
  int local_450;
  
  lVar2 = in_RDI[7];
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar3 = in_RSI[6];
  iVar4 = (*(int *)((long)in_RDI + 0x2c) * 2 + iVar1 * -2) * 0x10;
  for (local_450 = 0; local_450 < (int)lVar2; local_450 = local_450 + 1) {
    local_500 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_450 * in_RDI[2]);
    local_4a0 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_450 * in_RSI[2]);
    local_508 = (undefined1 (*) [64])(*local_500 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    for (local_50c = 0; local_50c < (int)lVar3; local_50c = local_50c + 1) {
      for (local_510 = 0; local_510 < iVar1; local_510 = local_510 + 1) {
        auVar5 = vmaxps_avx512f(*local_500,local_500[1]);
        auVar6 = vmaxps_avx512f(*local_508,local_508[1]);
        auVar5 = vmaxps_avx512f(auVar5,auVar6);
        local_700 = auVar5._0_8_;
        uStack_6f8 = auVar5._8_8_;
        uStack_6f0 = auVar5._16_8_;
        uStack_6e8 = auVar5._24_8_;
        uStack_6e0 = auVar5._32_8_;
        uStack_6d8 = auVar5._40_8_;
        uStack_6d0 = auVar5._48_8_;
        uStack_6c8 = auVar5._56_8_;
        *local_4a0 = local_700;
        local_4a0[1] = uStack_6f8;
        local_4a0[2] = uStack_6f0;
        local_4a0[3] = uStack_6e8;
        local_4a0[4] = uStack_6e0;
        local_4a0[5] = uStack_6d8;
        local_4a0[6] = uStack_6d0;
        local_4a0[7] = uStack_6c8;
        local_500 = local_500 + 2;
        local_508 = local_508 + 2;
        local_4a0 = local_4a0 + 8;
      }
      local_500 = (undefined1 (*) [64])(*local_500 + (long)iVar4 * 4);
      local_508 = (undefined1 (*) [64])(*local_508 + (long)iVar4 * 4);
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m512 _r00 = _mm512_loadu_ps(r0);
                __m512 _r01 = _mm512_loadu_ps(r0 + 16);
                __m512 _r10 = _mm512_loadu_ps(r1);
                __m512 _r11 = _mm512_loadu_ps(r1 + 16);

                __m512 _max0 = _mm512_max_ps(_r00, _r01);
                __m512 _max1 = _mm512_max_ps(_r10, _r11);
                __m512 _max = _mm512_max_ps(_max0, _max1);

                _mm512_storeu_ps(outptr, _max);

                r0 += 32;
                r1 += 32;
                outptr += 16;
            }

            r0 += tailstep;
            r1 += tailstep;
        }
    }
}